

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O3

int lws_urldecode(char *string,char *escaped,int len)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  
  bVar1 = *escaped;
  if (bVar1 != 0 && len != 0) {
    bVar2 = 0;
    iVar4 = 0;
    do {
      while (escaped = (char *)((byte *)escaped + 1), iVar4 != 0) {
        if (iVar4 == 1) {
          bVar2 = bVar1 - 0x30;
          if (9 < bVar2) {
            if ((byte)(bVar1 + 0x9f) < 6) {
              bVar2 = bVar1 + 0xa9;
            }
            else {
              if ((byte)(bVar1 + 0xb9) < 0xfa) {
                return -1;
              }
              bVar2 = bVar1 - 0x37;
            }
          }
          bVar2 = bVar2 << 4;
          iVar4 = 2;
        }
        else {
          bVar3 = bVar1 - 0x30;
          if (9 < bVar3) {
            if ((byte)(bVar1 + 0x9f) < 6) {
              bVar3 = bVar1 + 0xa9;
            }
            else {
              if ((byte)(bVar1 + 0xb9) < 0xfa) {
                return -1;
              }
              bVar3 = bVar1 - 0x37;
            }
          }
          *string = bVar3 | bVar2;
LAB_0011977e:
          string = (char *)((byte *)string + 1);
          len = len + -1;
          iVar4 = 0;
        }
        bVar1 = *escaped;
        if (bVar1 == 0) goto LAB_00119794;
joined_r0x0011978e:
        if (len == 0) goto LAB_00119794;
      }
      if (bVar1 != 0x25) {
        if (bVar1 != 0x2b) {
          *string = bVar1;
          goto LAB_0011977e;
        }
        *string = 0x20;
        string = (char *)((byte *)string + 1);
        bVar1 = *escaped;
        if (bVar1 != 0) {
          iVar4 = 0;
          len = len + -1;
          goto joined_r0x0011978e;
        }
        break;
      }
      bVar1 = *escaped;
      iVar4 = 1;
    } while (bVar1 != 0);
  }
LAB_00119794:
  *string = 0;
  return 0;
}

Assistant:

int
lws_urldecode(char *string, const char *escaped, int len)
{
	int state = 0, n;
	char sum = 0;

	while (*escaped && len) {
		switch (state) {
		case 0:
			if (*escaped == '%') {
				state++;
				escaped++;
				continue;
			}
			if (*escaped == '+') {
				escaped++;
				*string++ = ' ';
				len--;
				continue;
			}
			*string++ = *escaped++;
			len--;
			break;
		case 1:
			n = char_to_hex(*escaped);
			if (n < 0)
				return -1;
			escaped++;
			sum = (char)(n << 4);
			state++;
			break;

		case 2:
			n = char_to_hex(*escaped);
			if (n < 0)
				return -1;
			escaped++;
			*string++ = (char)(sum | n);
			len--;
			state = 0;
			break;
		}

	}
	*string = '\0';

	return 0;
}